

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O0

void __thiscall
cali::Blackboard::add(Blackboard *this,cali_id_t key,Entry *value,bool include_in_snapshots)

{
  size_t sVar1;
  unsigned_long *puVar2;
  size_t I;
  bool include_in_snapshots_local;
  Entry *value_local;
  cali_id_t key_local;
  Blackboard *this_local;
  
  sVar1 = find_free_slot(this,key);
  if (this->num_entries + 0x70 < 0x3fe) {
    this->hashtable[sVar1].key = key;
    this->hashtable[sVar1].value.m_node = value->m_node;
    this->hashtable[sVar1].value.m_value.m_v.type_and_size = (value->m_value).m_v.type_and_size;
    this->hashtable[sVar1].value.m_value.m_v.value = (value->m_value).m_v.value;
    if (include_in_snapshots) {
      this->toc[sVar1 >> 5] = 1 << ((byte)sVar1 & 0x1f) | this->toc[sVar1 >> 5];
      this->toctoc = 1 << ((byte)(sVar1 >> 5) & 0x1f) | this->toctoc;
    }
    this->num_entries = this->num_entries + 1;
    puVar2 = std::max<unsigned_long>(&this->num_entries,&this->max_num_entries);
    this->max_num_entries = *puVar2;
  }
  else {
    this->num_skipped = this->num_skipped + 1;
  }
  return;
}

Assistant:

void Blackboard::add(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_free_slot(key);

    if (num_entries + (Nmax / 10 + 10) > Nmax) {
        ++num_skipped; // Uh oh, we're full
        return;
    }

    hashtable[I].key   = key;
    hashtable[I].value = value;

    if (include_in_snapshots) {
        toc[I / 32] |= (1 << (I % 32));
        toctoc |= (1 << (I / 32));
    }

    ++num_entries;
    max_num_entries = std::max(num_entries, max_num_entries);
}